

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

int SaveConfigToStream(TidyDocImpl *doc,StreamOut *out)

{
  TidyOptionId TVar1;
  TidyOptionType TVar2;
  TidyOptionImpl *option;
  TidyAllocator *pTVar3;
  _func_void_ptr_TidyAllocator_ptr_size_t *p_Var4;
  uint uVar5;
  int iVar6;
  tmbstr ptVar7;
  ulong uVar8;
  int iVar9;
  TidyOptionImpl *option_00;
  bool bVar10;
  tmbchar local_58 [40];
  
  option_00 = option_defs;
  do {
    option_00 = option_00 + 1;
    option = (TidyOptionImpl *)option_00->name;
    if (option == (TidyOptionImpl *)0x0) {
      return 0;
    }
    iVar6 = 0;
    iVar9 = 0;
    if (option_00->parser != (ParseProperty *)0x0) {
      TVar1 = option_00->id;
      TVar2 = option_00->type;
      if (TVar2 == TidyString) {
        ptVar7 = (doc->config).value[TVar1].p;
        if (ptVar7 != option_00->pdflt) goto LAB_00130bf6;
LAB_00130be1:
        if (TVar1 == TidyDoctype) {
LAB_00130bff:
          uVar8 = (doc->config).value[0xe].v;
          iVar6 = iVar9;
          if (uVar8 != 2) {
            if (uVar8 != 5) goto LAB_00130c96;
            pTVar3 = doc->allocator;
            p_Var4 = pTVar3->vtbl->alloc;
            uVar5 = prvTidytmbstrlen(ptVar7);
            ptVar7 = (tmbstr)(*p_Var4)(pTVar3,(long)uVar5 + 2);
            if (ptVar7 != (tmbstr)0x0) {
              ptVar7[0] = '\"';
              ptVar7[1] = '\0';
              prvTidytmbstrcat(ptVar7,(doc->config).value[TVar1].p);
              prvTidytmbstrcat(ptVar7,"\"");
              WriteOptionString(option,ptVar7,out);
              (*doc->allocator->vtbl->free)(doc->allocator,ptVar7);
            }
          }
        }
      }
      else {
        ptVar7 = (doc->config).value[TVar1].p;
        if (ptVar7 == (ctmbstr)option_00->dflt) goto LAB_00130be1;
LAB_00130bf6:
        if (TVar1 == TidyDoctype) goto LAB_00130bff;
        if (option_00->pickList == (PickListItems *)0x0) {
          if (TVar2 == TidyBoolean) {
            bVar10 = ptVar7 == (ctmbstr)0x0;
            ptVar7 = "yes";
            if (bVar10) {
              ptVar7 = "no";
            }
          }
          else if (TVar2 == TidyInteger) {
            local_58[0x10] = '\0';
            local_58[0x11] = '\0';
            local_58[0x12] = '\0';
            local_58[0x13] = '\0';
            local_58[0x14] = '\0';
            local_58[0x15] = '\0';
            local_58[0x16] = '\0';
            local_58[0x17] = '\0';
            local_58[0x18] = '\0';
            local_58[0x19] = '\0';
            local_58[0x1a] = '\0';
            local_58[0x1b] = '\0';
            local_58[0x1c] = '\0';
            local_58[0x1d] = '\0';
            local_58[0x1e] = '\0';
            local_58[0x1f] = '\0';
            local_58[0] = '\0';
            local_58[1] = '\0';
            local_58[2] = '\0';
            local_58[3] = '\0';
            local_58[4] = '\0';
            local_58[5] = '\0';
            local_58[6] = '\0';
            local_58[7] = '\0';
            local_58[8] = '\0';
            local_58[9] = '\0';
            local_58[10] = '\0';
            local_58[0xb] = '\0';
            local_58[0xc] = '\0';
            local_58[0xd] = '\0';
            local_58[0xe] = '\0';
            local_58[0xf] = '\0';
            ptVar7 = local_58;
            prvTidytmbsnprintf(ptVar7,0x20,"%u");
          }
          else {
            iVar6 = iVar9;
            if (TVar2 != TidyString) goto LAB_00130ca2;
          }
          iVar6 = 0;
          WriteOptionString(option,ptVar7,out);
          goto LAB_00130ca2;
        }
        uVar8 = (ulong)ptVar7 & 0xffffffff;
LAB_00130c96:
        iVar6 = WriteOptionPick(option_00,(uint)uVar8,out);
      }
    }
LAB_00130ca2:
    if (iVar6 != 0) {
      return -1;
    }
  } while( true );
}

Assistant:

static int  SaveConfigToStream( TidyDocImpl* doc, StreamOut* out )
{
    int rc = 0;
    const TidyOptionImpl* option;
    for ( option=option_defs+1; 0==rc && option && option->name; ++option )
    {
        const TidyOptionValue* val = &doc->config.value[ option->id ];
        if ( option->parser == NULL )
            continue;
        if ( OptionValueEqDefault( option, val ) && option->id != TidyDoctype)
            continue;

        if ( option->id == TidyDoctype )  /* Special case */
        {
          ulong dtmode = cfg( doc, TidyDoctypeMode );
          if ( dtmode == TidyDoctypeUser )
          {
            tmbstr t;
            
            /* add 2 double quotes */
            if (( t = (tmbstr)TidyDocAlloc( doc, TY_(tmbstrlen)( val->p ) + 2 ) ))
            {
              t[0] = '\"'; t[1] = 0;
            
              TY_(tmbstrcat)( t, val->p );
              TY_(tmbstrcat)( t, "\"" );
              rc = WriteOptionString( option, t, out );
            
              TidyDocFree( doc, t );
            }
          }
          else if ( dtmode == option_defs[TidyDoctypeMode].dflt )
            continue;
          else
            rc = WriteOptionPick( option, dtmode, out );
        }
        else if ( option->pickList)
          rc = WriteOptionPick( option, val->v, out );
        else
        {
          switch ( option->type )
          {
          case TidyString:
            rc = WriteOptionString( option, val->p, out );
            break;
          case TidyInteger:
            rc = WriteOptionInt( option, val->v, out );
            break;
          case TidyBoolean:
            rc = WriteOptionBool( option, val->v ? yes : no, out );
            break;
          }
        }
    }
    return rc;
}